

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callFunctionTestSuite.cpp
# Opt level: O2

int __thiscall Test::max<int>(Test *this,int *lhs,int *rhs)

{
  int iVar1;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"max",&local_41);
  incrementMethodVisitedCounter(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  iVar1 = *rhs;
  if (*rhs < *lhs) {
    iVar1 = *lhs;
  }
  return iVar1;
}

Assistant:

T max(T& lhs, T& rhs)
  {
    incrementMethodVisitedCounter("max");
    return (lhs > rhs) ? lhs : rhs;
  }